

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatterSPH.cpp
# Opt level: O2

void __thiscall chrono::ChNodeSPH::ArchiveOUT(ChNodeSPH *this)

{
  ChArchiveOut *in_RSI;
  
  ArchiveOUT((ChNodeSPH *)
             ((long)(this->super_ChNodeXYZ).pos.m_data +
             *(long *)((long)(this->super_ChNodeXYZ).super_ChLoadableUVW + -0xb8) + -8),in_RSI);
  return;
}

Assistant:

void ChNodeSPH::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChNodeSPH>();

    // serialize parent class
    ChNodeXYZ::ArchiveOUT(marchive);

    // serialize all member data:
    // marchive << CHNVP(container);
    marchive << CHNVP(collision_model);
    marchive << CHNVP(UserForce);
    marchive << CHNVP(volume);
    marchive << CHNVP(density);
    marchive << CHNVP(h_rad);
    marchive << CHNVP(coll_rad);
    marchive << CHNVP(pressure);
}